

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O2

Quaternion QuaternionMultiply(Quaternion q1,Quaternion q2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  Quaternion QVar9;
  
  fVar2 = q1.x;
  fVar3 = q1.y;
  fVar1 = q1.z;
  fVar4 = q1.w;
  fVar5 = q2.x;
  fVar6 = q2.y;
  fVar7 = q2.z;
  fVar8 = q2.w;
  QVar9.x = -fVar1 * fVar6 + fVar7 * fVar3 + fVar8 * fVar2 + fVar5 * fVar4;
  QVar9.y = -fVar2 * fVar7 + fVar5 * fVar1 + fVar8 * fVar3 + fVar6 * fVar4;
  QVar9.w = -fVar1 * fVar7 + fVar6 * -fVar3 + fVar8 * fVar4 + -fVar2 * fVar5;
  QVar9.z = -fVar3 * fVar5 + fVar2 * fVar6 + fVar8 * fVar1 + fVar7 * fVar4;
  return QVar9;
}

Assistant:

RMDEF Quaternion QuaternionMultiply(Quaternion q1, Quaternion q2)
{
    Quaternion result = { 0 };

    float qax = q1.x, qay = q1.y, qaz = q1.z, qaw = q1.w;
    float qbx = q2.x, qby = q2.y, qbz = q2.z, qbw = q2.w;

    result.x = qax*qbw + qaw*qbx + qay*qbz - qaz*qby;
    result.y = qay*qbw + qaw*qby + qaz*qbx - qax*qbz;
    result.z = qaz*qbw + qaw*qbz + qax*qby - qay*qbx;
    result.w = qaw*qbw - qax*qbx - qay*qby - qaz*qbz;

    return result;
}